

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PType::FillConversionPath(PType *this,Conversion **slots)

{
  Conversion *pCVar1;
  PType *local_20;
  PType *node;
  Conversion **slots_local;
  PType *this_local;
  
  local_20 = this;
  while( true ) {
    if (local_20->Distance < 0) {
      return;
    }
    if (local_20->PredType == (PType *)0x0) break;
    pCVar1 = TArray<PType::Conversion,_PType::Conversion>::operator[]
                       (&local_20->PredType->Conversions,(long)local_20->PredConv);
    slots[local_20->Distance] = pCVar1;
    local_20 = local_20->PredType;
  }
  __assert_fail("node->PredType != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0x149,"void PType::FillConversionPath(const PType::Conversion **)");
}

Assistant:

void PType::FillConversionPath(const PType::Conversion **slots)
{
	for (PType *node = this; node->Distance >= 0; node = node->PredType)
	{
		assert(node->PredType != NULL);
		slots[node->Distance] = &node->PredType->Conversions[node->PredConv];
	}
}